

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_char(Curl_easy *data,CURLINFO info,char **param_charp)

{
  char *local_38;
  char **param_charp_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_EFFECTIVE_URL:
    if ((data->change).url == (char *)0x0) {
      local_38 = "";
    }
    else {
      local_38 = (data->change).url;
    }
    *param_charp = local_38;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_CONTENT_TYPE:
    *param_charp = (data->info).contenttype;
    break;
  case CURLINFO_PRIVATE:
    *param_charp = (char *)(data->set).private_data;
    break;
  case CURLINFO_FTP_ENTRY_PATH:
    *param_charp = (data->state).most_recent_ftp_entrypath;
    break;
  case CURLINFO_REDIRECT_URL:
    *param_charp = (data->info).wouldredirect;
    break;
  case CURLINFO_PRIMARY_IP:
    *param_charp = (data->info).conn_primary_ip;
    break;
  case CURLINFO_RTSP_SESSION_ID:
    *param_charp = (data->set).str[0x2f];
    break;
  case CURLINFO_LOCAL_IP:
    *param_charp = (data->info).conn_local_ip;
    break;
  case CURLINFO_SCHEME:
    *param_charp = (data->info).conn_scheme;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_char(struct Curl_easy *data, CURLINFO info,
                             const char **param_charp)
{
  switch(info) {
  case CURLINFO_EFFECTIVE_URL:
    *param_charp = data->change.url?data->change.url:(char *)"";
    break;
  case CURLINFO_CONTENT_TYPE:
    *param_charp = data->info.contenttype;
    break;
  case CURLINFO_PRIVATE:
    *param_charp = (char *) data->set.private_data;
    break;
  case CURLINFO_FTP_ENTRY_PATH:
    /* Return the entrypath string from the most recent connection.
       This pointer was copied from the connectdata structure by FTP.
       The actual string may be free()ed by subsequent libcurl calls so
       it must be copied to a safer area before the next libcurl call.
       Callers must never free it themselves. */
    *param_charp = data->state.most_recent_ftp_entrypath;
    break;
  case CURLINFO_REDIRECT_URL:
    /* Return the URL this request would have been redirected to if that
       option had been enabled! */
    *param_charp = data->info.wouldredirect;
    break;
  case CURLINFO_PRIMARY_IP:
    /* Return the ip address of the most recent (primary) connection */
    *param_charp = data->info.conn_primary_ip;
    break;
  case CURLINFO_LOCAL_IP:
    /* Return the source/local ip address of the most recent (primary)
       connection */
    *param_charp = data->info.conn_local_ip;
    break;
  case CURLINFO_RTSP_SESSION_ID:
    *param_charp = data->set.str[STRING_RTSP_SESSION_ID];
    break;
  case CURLINFO_SCHEME:
    *param_charp = data->info.conn_scheme;
    break;

  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}